

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_pad_reflect_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ggml_tensor *pgVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  void *pvVar15;
  int64_t iVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined4 *puVar26;
  undefined8 uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  
  pgVar6 = dst->src[0];
  if (pgVar6->type == GGML_TYPE_F32) {
    if (dst->type == GGML_TYPE_F32) {
      uVar2 = dst->op_params[0];
      uVar3 = dst->op_params[1];
      uVar7 = dst->ne[3];
      iVar4 = params->ith;
      iVar5 = params->nth;
      sVar8 = dst->nb[1];
      iVar16 = pgVar6->ne[0];
      lVar28 = (long)(int)uVar2 * dst->nb[0];
      sVar9 = pgVar6->nb[1];
      lVar18 = (~(long)(int)uVar3 + dst->ne[0]) * dst->nb[0];
      sVar10 = pgVar6->nb[3];
      uVar11 = dst->ne[2];
      lVar17 = sVar8 * (long)iVar4;
      lVar34 = sVar8 * (long)iVar5;
      local_108 = lVar17 + 4 + lVar28;
      local_110 = lVar18 + 4 + lVar17;
      local_118 = lVar18 + -4 + lVar17;
      local_120 = lVar17 + -4 + lVar28;
      sVar12 = pgVar6->nb[2];
      sVar13 = dst->nb[2];
      lVar17 = dst->ne[1];
      sVar14 = dst->nb[3];
      for (uVar23 = 0; uVar23 != (~((long)uVar7 >> 0x3f) & uVar7); uVar23 = uVar23 + 1) {
        lVar18 = local_118;
        lVar25 = local_110;
        lVar30 = local_120;
        lVar33 = local_108;
        for (uVar31 = 0; uVar31 != (~((long)uVar11 >> 0x3f) & uVar11); uVar31 = uVar31 + 1) {
          lVar22 = lVar18;
          lVar24 = lVar25;
          lVar29 = lVar30;
          lVar32 = lVar33;
          for (lVar19 = (long)iVar4; lVar19 < lVar17; lVar19 = lVar19 + iVar5) {
            pvVar15 = dst->data;
            ggml_vec_cpy_f32((int)iVar16,
                             (float *)(lVar19 * sVar8 + uVar31 * sVar13 + uVar23 * sVar14 + lVar28 +
                                      (long)pvVar15),
                             (float *)((long)pgVar6->data +
                                      lVar19 * sVar9 + uVar31 * sVar12 + uVar23 * sVar10));
            puVar26 = (undefined4 *)((long)pvVar15 + lVar29);
            for (uVar21 = 0; (~((int)uVar2 >> 0x1f) & uVar2) != uVar21; uVar21 = uVar21 + 1) {
              *puVar26 = *(undefined4 *)((long)pvVar15 + uVar21 * 4 + lVar32);
              puVar26 = puVar26 + -1;
            }
            puVar26 = (undefined4 *)((long)pvVar15 + lVar22);
            for (uVar21 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar21; uVar21 = uVar21 + 1) {
              uVar1 = *puVar26;
              puVar26 = puVar26 + -1;
              *(undefined4 *)((long)pvVar15 + uVar21 * 4 + lVar24) = uVar1;
            }
            lVar32 = lVar32 + lVar34;
            lVar29 = lVar29 + lVar34;
            lVar24 = lVar24 + lVar34;
            lVar22 = lVar22 + lVar34;
          }
          lVar33 = lVar33 + sVar13;
          lVar30 = lVar30 + sVar13;
          lVar25 = lVar25 + sVar13;
          lVar18 = lVar18 + sVar13;
        }
        local_108 = local_108 + sVar14;
        local_120 = local_120 + sVar14;
        local_110 = local_110 + sVar14;
        local_118 = local_118 + sVar14;
      }
      return;
    }
    pcVar20 = "dst->type == GGML_TYPE_F32";
    uVar27 = 0x1a18;
  }
  else {
    pcVar20 = "src0->type == GGML_TYPE_F32";
    uVar27 = 0x1a17;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar27,"GGML_ASSERT(%s) failed",pcVar20);
}

Assistant:

void ggml_compute_forward_pad_reflect_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    const int ith = params->ith;
    const int nth = params->nth;

    const int32_t * opts = (const int32_t *) dst->op_params;
    const int p0 = opts[0];
    const int p1 = opts[1];

    GGML_TENSOR_UNARY_OP_LOCALS

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {
            for (int64_t i1 = ith; i1 < ne1; i1 += nth) {
                float * left  = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 +         p0*nb0);
                float * right = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 + (ne0-p1-1)*nb0);

                ggml_vec_cpy_f32(ne00, left, (float *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01));

                for (int i0 = 1; i0 <= p0; i0++) { left[-i0] = left[i0];   }
                for (int i0 = 1; i0 <= p1; i0++) { right[i0] = right[-i0]; }
            }
        }
    }
}